

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

bool __thiscall
MemoryLeakDetector::validMemoryCorruptionInformation(MemoryLeakDetector *this,char *memory)

{
  size_t i;
  char *memory_local;
  MemoryLeakDetector *this_local;
  
  i = 0;
  while( true ) {
    if (2 < i) {
      return true;
    }
    if (memory[i] != "BAS"[i % 3]) break;
    i = i + 1;
  }
  return false;
}

Assistant:

bool MemoryLeakDetector::validMemoryCorruptionInformation(char* memory)
{
   for (size_t i=0; i<memory_corruption_buffer_size; i++)
      if (memory[i] != GuardBytes[i % sizeof(GuardBytes)])
          return false;
   return true;
}